

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteBool
               (int field_number,bool value,CodedOutputStream *output)

{
  undefined7 in_register_00000031;
  
  io::CodedOutputStream::WriteVarint32(output,field_number * 8);
  io::CodedOutputStream::WriteVarint32(output,(uint32)CONCAT71(in_register_00000031,value));
  return;
}

Assistant:

void WireFormatLite::WriteBool(int field_number, bool value,
                               io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteBoolNoTag(value, output);
}